

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.cpp
# Opt level: O1

string_view libtorrent::aux::integer_to_str(array<char,_21UL> *buf,integer_type val)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  char cVar11;
  char *pcVar12;
  long lVar13;
  size_t sVar14;
  long lVar15;
  char cVar16;
  char *pcVar17;
  integer_type iVar18;
  ulong uVar19;
  string_view sVar20;
  
  if (-1 < val) {
    cVar16 = (char)val;
    if (val < 10) {
      buf->_M_elems[0] = cVar16 + '0';
      sVar14 = 1;
      goto LAB_001b12ee;
    }
    if (val < 100) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (ulong)val / 10;
      cVar11 = (char)((ulong)val / 10);
      buf->_M_elems[0] = cVar11 + SUB161(auVar1 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
      buf->_M_elems[1] = cVar16 + cVar11 * -10 | 0x30;
      sVar14 = 2;
      goto LAB_001b12ee;
    }
    if (val < 1000) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (ulong)val / 100;
      buf->_M_elems[0] =
           (char)((ulong)val / 100) + SUB161(auVar2 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (ulong)val / 10;
      cVar11 = (char)((ulong)val / 10);
      buf->_M_elems[1] = cVar11 + SUB161(auVar3 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
      buf->_M_elems[2] = cVar16 + cVar11 * -10 | 0x30;
      sVar14 = 3;
      goto LAB_001b12ee;
    }
    if (val < 10000) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (ulong)val / 1000;
      buf->_M_elems[0] =
           (char)((ulong)val / 1000) + SUB161(auVar4 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (ulong)val / 100;
      buf->_M_elems[1] =
           (char)((ulong)val / 100) + SUB161(auVar5 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (ulong)val / 10;
      cVar11 = (char)((ulong)val / 10);
      buf->_M_elems[2] = cVar11 + SUB161(auVar6 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
      buf->_M_elems[3] = cVar16 + cVar11 * -10 | 0x30;
      sVar14 = 4;
      goto LAB_001b12ee;
    }
    if (val < 100000) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (ulong)val / 10000;
      buf->_M_elems[0] =
           (char)((ulong)val / 10000) + SUB161(auVar7 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (ulong)val / 1000;
      buf->_M_elems[1] =
           (char)((ulong)val / 1000) + SUB161(auVar8 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (ulong)val / 100;
      buf->_M_elems[2] =
           (char)((ulong)val / 100) + SUB161(auVar9 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = (ulong)val / 10;
      cVar11 = (char)((ulong)val / 10);
      buf->_M_elems[3] = cVar11 + SUB161(auVar10 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
      buf->_M_elems[4] = cVar16 + cVar11 * -10 | 0x30;
      sVar14 = 5;
      goto LAB_001b12ee;
    }
  }
  iVar18 = -val;
  if (val < 1) {
    iVar18 = val;
  }
  lVar15 = 1;
  pcVar12 = buf[1]._M_elems + 1;
  do {
    pcVar17 = pcVar12;
    pcVar17[-2] = '0' - ((char)iVar18 + (char)(iVar18 / 10) * -10);
    uVar19 = iVar18 + 9;
    lVar15 = lVar15 + -1;
    pcVar12 = pcVar17 + -1;
    iVar18 = iVar18 / 10;
  } while (0x12 < uVar19);
  lVar13 = -1;
  if (val < 1) {
    pcVar17[-3] = 0x2d;
    lVar13 = -2;
  }
  buf = (array<char,_21UL> *)(pcVar17 + -1 + lVar13);
  sVar14 = -(lVar15 + lVar13);
LAB_001b12ee:
  sVar20._M_str = buf->_M_elems;
  sVar20._M_len = sVar14;
  return sVar20;
}

Assistant:

string_view integer_to_str(std::array<char, 21>& buf, entry::integer_type val)
	{
		if (val >= 0)
		{
			if (val < 10)
			{
				buf[0] = '0' + static_cast<char>(val);
				return {buf.data(), std::size_t(1)};
			}
			if (val < 100)
			{
				buf[0] = '0' + (val / 10) % 10;
				buf[1] = '0' + val % 10;
				return {buf.data(), std::size_t(2)};
			}
			if (val < 1000)
			{
				buf[0] = '0' + (val / 100) % 10;
				buf[1] = '0' + (val / 10) % 10;
				buf[2] = '0' + val % 10;
				return {buf.data(), std::size_t(3)};
			}
			if (val < 10000)
			{
				buf[0] = '0' + (val / 1000) % 10;
				buf[1] = '0' + (val / 100) % 10;
				buf[2] = '0' + (val / 10) % 10;
				buf[3] = '0' + val % 10;
				return {buf.data(), std::size_t(4)};
			}
			if (val < 100000)
			{
				buf[0] = '0' + (val / 10000) % 10;
				buf[1] = '0' + (val / 1000) % 10;
				buf[2] = '0' + (val / 100) % 10;
				buf[3] = '0' + (val / 10) % 10;
				buf[4] = '0' + val % 10;
				return {buf.data(), std::size_t(5)};
			}
		}
		// val == 0 is handled in the fast-path above
		TORRENT_ASSERT(val != 0);
		// slow path
		// convert positive values to negative, since the negative space is
		// larger, so we can fit INT64_MIN
		int sign = 1;
		if (val > 0)
		{
			sign = 0;
			val = -val;
		}
		char* ptr = &buf.back();
		do
		{
			*ptr-- = '0' - char(val % 10);
			val /= 10;
		} while (val != 0);
		if (sign) *ptr-- = '-';
		++ptr;
		return {ptr, static_cast<std::size_t>(&buf.back() - ptr + 1)};
	}